

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

Promise<unsigned_long> __thiscall
kj::anon_unknown_123::PromisedAsyncIoStream::tryRead
          (PromisedAsyncIoStream *this,void *buffer,size_t minBytes,size_t maxBytes)

{
  long *plVar1;
  _func_int **pp_Var2;
  SourceLocation location;
  AsyncInputStream AVar3;
  void *pvVar4;
  ForkHub<kj::_::Void> *location_00;
  OwnPromiseNode intermediate;
  void *continuationTracePtr;
  ForkedPromise<void> local_90;
  code *local_80;
  AsyncInputStream local_78;
  undefined *local_70;
  undefined *puStack_68;
  undefined8 local_60;
  anon_class_32_4_a4bd11c1_for_func local_58;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_38;
  
  plVar1 = *(long **)((long)buffer + 0x30);
  if (plVar1 == (long *)0x0) {
    ForkedPromise<void>::addBranch(&local_90);
    local_80 = kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:2383:39)>
               ::anon_class_32_4_a4bd11c1_for_func::operator();
    pp_Var2 = local_90.hub.disposer[1]._vptr_Disposer;
    local_58.this = (PromisedAsyncIoStream *)buffer;
    local_58.buffer = (void *)minBytes;
    local_58.minBytes = maxBytes;
    if (pp_Var2 == (_func_int **)0x0 || (ulong)((long)local_90.hub.disposer - (long)pp_Var2) < 0x40)
    {
      pvVar4 = operator_new(0x400);
      location_00 = (ForkHub<kj::_::Void> *)((long)pvVar4 + 0x3c0);
      ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::PromisedAsyncIoStream::tryRead(void*,unsigned_long,unsigned_long)::_lambda()_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::PromisedAsyncIoStream::tryRead(void*,unsigned_long,unsigned_long)::_lambda()_1_,void*&>
                ((SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:2383:39)>
                  *)location_00,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_90,
                 &local_58,&local_80);
      *(void **)((long)pvVar4 + 0x3c8) = pvVar4;
    }
    else {
      local_90.hub.disposer[1]._vptr_Disposer = (_func_int **)0x0;
      location_00 = (ForkHub<kj::_::Void> *)(local_90.hub.disposer + -8);
      ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::PromisedAsyncIoStream::tryRead(void*,unsigned_long,unsigned_long)::_lambda()_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::PromisedAsyncIoStream::tryRead(void*,unsigned_long,unsigned_long)::_lambda()_1_,void*&>
                ((SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:2383:39)>
                  *)location_00,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_90,
                 &local_58,&local_80);
      local_90.hub.disposer[-7]._vptr_Disposer = pp_Var2;
    }
    local_70 = &DAT_003d3151;
    puStack_68 = &DAT_003d31b0;
    local_60 = 0x4c0000058b;
    location.function = &DAT_003d31b0;
    location.fileName = &DAT_003d3151;
    location.lineNumber = 0x58b;
    location.columnNumber = 0x4c;
    local_90.hub.ptr = location_00;
    kj::_::maybeChain<unsigned_long>
              ((OwnPromiseNode *)&local_78,(Promise<unsigned_long> *)&local_90.hub.ptr,location);
    AVar3._vptr_AsyncInputStream = local_78._vptr_AsyncInputStream;
    local_78._vptr_AsyncInputStream = (_func_int **)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_78);
    (this->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream =
         AVar3._vptr_AsyncInputStream;
    local_38.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_38);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_90.hub.ptr);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_90);
  }
  else {
    (**(code **)(*plVar1 + 8))(this,plVar1,minBytes,maxBytes);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

KJ_IF_SOME(s, stream) {
      return s->tryRead(buffer, minBytes, maxBytes);
    }